

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t archive_match_exclude_entry(archive *_a,wchar_t flag,archive_entry *entry)

{
  archive_rb_node *paVar1;
  int iVar2;
  wchar_t wVar3;
  archive_rb_node *self;
  char *pcVar4;
  archive_rb_node *paVar5;
  uintptr_t uVar6;
  
  iVar2 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_time_include_entry");
  if (iVar2 == -0x1e) {
LAB_0021e6da:
    wVar3 = L'\xffffffe2';
  }
  else {
    if (entry == (archive_entry *)0x0) {
      pcVar4 = "entry is NULL";
    }
    else {
      wVar3 = validate_time_flag(_a,flag,"archive_match_exclude_entry");
      if (wVar3 != L'\0') {
        return wVar3;
      }
      self = (archive_rb_node *)calloc(1,0xb0);
      if (self == (archive_rb_node *)0x0) {
        error_nomem((archive_match *)_a);
        goto LAB_0021e6da;
      }
      pcVar4 = archive_entry_pathname(entry);
      if (pcVar4 != (char *)0x0) {
        archive_mstring_copy_mbs((archive_mstring *)(self[1].rb_nodes + 1),pcVar4);
        _a[2].error_string.length = (size_t)&rb_ops_mbs;
        *(wchar_t *)&self[5].rb_info = flag;
        paVar5 = (archive_rb_node *)archive_entry_mtime(entry);
        self[6].rb_nodes[0] = paVar5;
        paVar5 = (archive_rb_node *)archive_entry_mtime_nsec(entry);
        self[6].rb_nodes[1] = paVar5;
        uVar6 = archive_entry_ctime(entry);
        self[6].rb_info = uVar6;
        paVar5 = (archive_rb_node *)archive_entry_ctime_nsec(entry);
        self[7].rb_nodes[0] = paVar5;
        iVar2 = __archive_rb_tree_insert_node((archive_rb_tree *)&_a[2].error_string,self);
        if (iVar2 == 0) {
          paVar5 = __archive_rb_tree_find_node((archive_rb_tree *)&_a[2].error_string,pcVar4);
          if (paVar5 != (archive_rb_node *)0x0) {
            *(int *)&paVar5[5].rb_info = (int)self[5].rb_info;
            paVar1 = self[6].rb_nodes[1];
            paVar5[6].rb_nodes[0] = self[6].rb_nodes[0];
            paVar5[6].rb_nodes[1] = paVar1;
            paVar1 = self[7].rb_nodes[0];
            paVar5[6].rb_info = self[6].rb_info;
            paVar5[7].rb_nodes[0] = paVar1;
          }
          archive_mstring_clean((archive_mstring *)(self[1].rb_nodes + 1));
          free(self);
        }
        else {
          *(archive_rb_node **)_a[2].current_code = self;
          _a[2].current_code = (char *)(self + 1);
          _a[2].current_codepage = _a[2].current_codepage + 1;
          *(byte *)&_a[1].magic = (byte)_a[1].magic | 2;
        }
        return L'\0';
      }
      free(self);
      pcVar4 = "pathname is NULL";
    }
    archive_set_error(_a,0x16,pcVar4);
    wVar3 = L'\xffffffe7';
  }
  return wVar3;
}

Assistant:

int
archive_match_exclude_entry(struct archive *_a, int flag,
    struct archive_entry *entry)
{
	struct archive_match *a;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_time_include_entry");
	a = (struct archive_match *)_a;

	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}
	r = validate_time_flag(_a, flag, "archive_match_exclude_entry");
	if (r != ARCHIVE_OK)
		return (r);
	return (add_entry(a, flag, entry));
}